

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::NonAnsiPortListSyntax::NonAnsiPortListSyntax
          (NonAnsiPortListSyntax *this,Token openParen,
          SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax> *ports,Token closeParen)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar6 = closeParen._0_8_;
  uVar5 = openParen._0_8_;
  (this->super_PortListSyntax).super_SyntaxNode.kind = NonAnsiPortList;
  (this->super_PortListSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_PortListSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (this->openParen).kind = (short)uVar5;
  (this->openParen).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openParen).info = openParen.info;
  uVar3 = *(undefined4 *)&(ports->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (ports->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->ports).super_SyntaxListBase.super_SyntaxNode.kind =
       (ports->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->ports).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->ports).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->ports).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (ports->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->ports).super_SyntaxListBase.childCount = (ports->super_SyntaxListBase).childCount;
  (this->ports).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005cc0a8;
  sVar2 = (ports->elements)._M_extent._M_extent_value;
  (this->ports).elements._M_ptr = (ports->elements)._M_ptr;
  (this->ports).elements._M_extent._M_extent_value = sVar2;
  (this->closeParen).kind = (short)uVar6;
  (this->closeParen).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->closeParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->closeParen).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->closeParen).info = closeParen.info;
  (this->ports).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar7 = (this->ports).elements._M_extent._M_extent_value + 1;
  if (1 < uVar7) {
    uVar7 = uVar7 >> 1;
    lVar8 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->ports).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar8));
      (*ppSVar4)->parent = (SyntaxNode *)this;
      lVar8 = lVar8 + 0x30;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

ArgumentSyntax(SyntaxKind kind) :
        SyntaxNode(kind) {
    }